

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O2

int Abc_CommandAbs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Wlc_Ntk_t *p;
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  Wlc_Par_t Pars;
  
  p = (Wlc_Ntk_t *)pAbc->pAbcWlc;
  Wlc_ManSetDefaultParams(&Pars);
  Extra_UtilGetoptReset();
LAB_002faf80:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"AMXFILdxvwh");
    iVar1 = globalUtilOptind;
    switch(iVar2) {
    case 0x46:
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-F\" should be followed by an integer.\n";
LAB_002fb10c:
        Abc_Print(-1,pcVar3);
        goto switchD_002fafd9_caseD_47;
      }
      iVar2 = atoi(argv[globalUtilOptind]);
      Pars.nBitsFlop = iVar2;
      break;
    case 0x47:
    case 0x48:
    case 0x4a:
    case 0x4b:
      goto switchD_002fafd9_caseD_47;
    case 0x49:
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-I\" should be followed by an integer.\n";
        goto LAB_002fb10c;
      }
      iVar2 = atoi(argv[globalUtilOptind]);
      Pars.nIterMax = iVar2;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-L\" should be followed by an integer.\n";
        goto LAB_002fb10c;
      }
      iVar2 = atoi(argv[globalUtilOptind]);
      Pars.nLimit = iVar2;
      break;
    case 0x4d:
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-M\" should be followed by an integer.\n";
        goto LAB_002fb10c;
      }
      iVar2 = atoi(argv[globalUtilOptind]);
      Pars.nBitsMul = iVar2;
      break;
    default:
      if (iVar2 == 0x41) {
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-A\" should be followed by an integer.\n";
          goto LAB_002fb10c;
        }
        iVar2 = atoi(argv[globalUtilOptind]);
        Pars.nBitsAdd = iVar2;
      }
      else {
        if (iVar2 != 0x58) {
          if (iVar2 == 100) {
            Pars.fAbs2 = Pars.fAbs2 ^ 1;
          }
          else if (iVar2 == 0x76) {
            Pars.fVerbose = Pars.fVerbose ^ 1;
          }
          else if (iVar2 == 0x77) {
            Pars.fPdrVerbose = Pars.fPdrVerbose ^ 1;
          }
          else {
            if (iVar2 != 0x78) {
              if (iVar2 == -1) {
                if (p != (Wlc_Ntk_t *)0x0) {
                  Wlc_NtkAbsCore(p,&Pars);
                  return 0;
                }
                Abc_Print(1,"Abc_CommandCone(): There is no current design.\n");
                return 0;
              }
              goto switchD_002fafd9_caseD_47;
            }
            Pars.fXorOutput = Pars.fXorOutput ^ 1;
          }
          goto LAB_002faf80;
        }
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-X\" should be followed by an integer.\n";
          goto LAB_002fb10c;
        }
        iVar2 = atoi(argv[globalUtilOptind]);
        Pars.nBitsMux = iVar2;
      }
    }
    globalUtilOptind = iVar1 + 1;
    if (iVar2 < 0) {
switchD_002fafd9_caseD_47:
      Abc_Print(-2,"usage: %%abs [-AMXFIL num] [-dxvwh]\n");
      Abc_Print(-2,"\t         abstraction for word-level networks\n");
      Abc_Print(-2,
                "\t-A num : minimum bit-width of an adder/subtractor to abstract [default = %d]\n",
                (ulong)(uint)Pars.nBitsAdd);
      Abc_Print(-2,"\t-M num : minimum bit-width of a multiplier to abstract [default = %d]\n",
                (ulong)(uint)Pars.nBitsMul);
      Abc_Print(-2,"\t-X num : minimum bit-width of a MUX operator to abstract [default = %d]\n",
                (ulong)(uint)Pars.nBitsMux);
      Abc_Print(-2,"\t-F num : minimum bit-width of a flip-flop to abstract [default = %d]\n",
                (ulong)(uint)Pars.nBitsFlop);
      Abc_Print(-2,"\t-I num : maximum number of CEGAR iterations [default = %d]\n",
                (ulong)(uint)Pars.nIterMax);
      Abc_Print(-2,"\t-L num : maximum number of each type of signals [default = %d]\n",
                (ulong)(uint)Pars.nLimit);
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (Pars.fAbs2 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle using another way of creating abstractions [default = %s]\n",
                pcVar3);
      pcVar3 = "yes";
      if (Pars.fXorOutput == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-x     : toggle XORing outputs of word-level miter [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (Pars.fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      if (Pars.fPdrVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printing verbose PDR output [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    Wlc_Par_t Pars, * pPars = &Pars;
    int c;
    Wlc_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "AMXFILdxvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsAdd = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsAdd < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsMul = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsMul < 0 )
                goto usage;
            break;
        case 'X':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-X\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsMux = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsMux < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsFlop = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsFlop < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLimit < 0 )
                goto usage;
            break;
        case 'd':
            pPars->fAbs2 ^= 1;
            break;
        case 'x':
            pPars->fXorOutput ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fPdrVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandCone(): There is no current design.\n" );
        return 0;
    }
    Wlc_NtkAbsCore( pNtk, pPars );
    return 0;
usage:
    Abc_Print( -2, "usage: %%abs [-AMXFIL num] [-dxvwh]\n" );
    Abc_Print( -2, "\t         abstraction for word-level networks\n" );
    Abc_Print( -2, "\t-A num : minimum bit-width of an adder/subtractor to abstract [default = %d]\n", pPars->nBitsAdd );
    Abc_Print( -2, "\t-M num : minimum bit-width of a multiplier to abstract [default = %d]\n",        pPars->nBitsMul );
    Abc_Print( -2, "\t-X num : minimum bit-width of a MUX operator to abstract [default = %d]\n",      pPars->nBitsMux );
    Abc_Print( -2, "\t-F num : minimum bit-width of a flip-flop to abstract [default = %d]\n",         pPars->nBitsFlop );
    Abc_Print( -2, "\t-I num : maximum number of CEGAR iterations [default = %d]\n",                   pPars->nIterMax );
    Abc_Print( -2, "\t-L num : maximum number of each type of signals [default = %d]\n",               pPars->nLimit );
    Abc_Print( -2, "\t-d     : toggle using another way of creating abstractions [default = %s]\n",    pPars->fAbs2? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle XORing outputs of word-level miter [default = %s]\n",            pPars->fXorOutput? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",                  pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing verbose PDR output [default = %s]\n",                   pPars->fPdrVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}